

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

void __thiscall CaDiCaL::Internal::analyze(Internal *this)

{
  int64_t *piVar1;
  long *plVar2;
  Internal *pIVar3;
  iterator iVar4;
  Clause *c;
  unsigned_long *puVar5;
  pointer piVar6;
  iterator __position;
  pointer piVar7;
  pointer puVar8;
  pointer puVar9;
  unsigned_long uVar10;
  uint uVar11;
  int iVar12;
  unsigned_long *puVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  Clause *pCVar20;
  unsigned_long *puVar21;
  unsigned_long *puVar22;
  pointer puVar23;
  time_t *in_RSI;
  Internal *__timer;
  Internal *pIVar24;
  time_t *ptVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  iterator __end4;
  Clause *__range1;
  unsigned_long *puVar29;
  double s;
  double s_00;
  double s_01;
  double s_02;
  double s_03;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int antecedent_size;
  int resolvent_size;
  int open;
  int jump;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  double local_60;
  ulong local_58;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_50;
  int local_44;
  EMA *local_40;
  EMA *local_38;
  
  pIVar24 = this->internal;
  if ((pIVar24->profiles).analyze.level <= (pIVar24->opts).profile) {
    time(pIVar24,in_RSI);
    start_profiling(pIVar24,&(pIVar24->profiles).analyze,s);
  }
  auVar31._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_assigned);
  auVar31._8_4_ = (int)(this->num_assigned >> 0x20);
  auVar31._12_4_ = 0x45300000;
  EMA::update(&(this->averages).current.trail.fast,this->internal,
              (auVar31._8_8_ - 1.9342813113834067e+25) + (auVar31._0_8_ - 4503599627370496.0),
              "averages.current.trail.fast");
  pIVar24 = this->internal;
  auVar32._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_assigned);
  auVar32._8_4_ = (int)(this->num_assigned >> 0x20);
  auVar32._12_4_ = 0x45300000;
  EMA::update(&(this->averages).current.trail.slow,pIVar24,
              (auVar32._8_8_ - 1.9342813113834067e+25) + (auVar32._0_8_ - 4503599627370496.0),
              "averages.current.trail.slow");
  if (((this->external_prop == true) && (this->external_prop_is_lazy == false)) &&
     ((this->opts).exteagerreasons != 0)) {
    explain_external_propagations(this);
  }
  if (((this->opts).chrono != 0) || (this->external_prop == true)) {
    uVar16 = find_conflict_level(this,(int *)&local_58);
    iVar18 = (int)local_58;
    if ((int)local_58 == 0) {
      pIVar24 = (Internal *)(ulong)uVar16;
      backtrack(this,uVar16);
    }
    else {
      backtrack(this,uVar16 - 1);
      build_chain_for_units(this,(int)local_58,this->conflict,false);
      __timer = (Internal *)(local_58 & 0xffffffff);
      search_assign_driving(this,(int)local_58,this->conflict);
      this->conflict = (Clause *)0x0;
      pIVar3 = this->internal;
      pIVar24 = __timer;
      if ((pIVar3->profiles).analyze.level <= (pIVar3->opts).profile) {
        pIVar24 = (Internal *)&(pIVar3->profiles).analyze;
        time(pIVar3,(time_t *)__timer);
        stop_profiling(pIVar3,(Profile *)pIVar24,s_00);
      }
    }
    if (iVar18 != 0) {
      return;
    }
  }
  if (this->level == 0) {
    learn_empty_clause(this);
    if (this->external->learner != (Learner *)0x0) {
      External::export_learned_empty_clause(this->external);
    }
    pIVar3 = this->internal;
    if ((pIVar3->profiles).analyze.level <= (pIVar3->opts).profile) {
      time(pIVar3,(time_t *)pIVar24);
      stop_profiling(pIVar3,&(pIVar3->profiles).analyze,s_02);
    }
    return;
  }
  local_38 = (EMA *)&(this->averages).current;
  pCVar20 = this->conflict;
  uVar26 = (ulong)((long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  local_64 = 0;
  local_68 = 0;
  local_44 = (this->opts).otfs;
  local_50 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain;
  local_40 = &(this->averages).current.level;
  iVar18 = 0;
  local_70 = 0;
  uVar16 = 0;
  do {
    local_6c = 1;
    uVar28 = *(uint *)&pCVar20->field_0x8;
    *(uint *)&pCVar20->field_0x8 = uVar28 & 0xffff3fff | 0x4000;
    if ((uVar28 & 0x940) == 0x800) {
      iVar17 = recompute_glue(this,pCVar20);
      if (iVar17 < pCVar20->glue) {
        promote_clause(this,pCVar20,iVar17);
      }
      else if (((uVar28 & 0xc000) != 0) && (pCVar20->glue <= (this->opts).reducetier2glue)) {
        *(uint *)&pCVar20->field_0x8 = *(uint *)&pCVar20->field_0x8 & 0xffff3fff | 0x8000;
      }
    }
    local_60 = (double)CONCAT44(local_60._4_4_,iVar18);
    if (this->lrat == true) {
      iVar4._M_current =
           (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_50,iVar4,(unsigned_long *)pCVar20);
      }
      else {
        *iVar4._M_current = (unsigned_long)pCVar20->field_0;
        (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
    }
    iVar18 = pCVar20->size;
    if ((long)iVar18 != 0) {
      lVar27 = 0;
      do {
        uVar28 = *(uint *)((long)&pCVar20[1].field_0 + lVar27);
        if (uVar28 != uVar16) {
          analyze_literal(this,uVar28,&local_64,&local_68,&local_6c);
        }
        lVar27 = lVar27 + 4;
      } while ((long)iVar18 * 4 != lVar27);
    }
    if (local_60._0_4_ == 0) {
      local_70 = local_6c + -1;
    }
    iVar18 = local_60._0_4_;
    if ((((local_44 != 0) && (0 < (int)local_60._0_4_)) && (2 < local_6c)) && (local_68 < local_6c))
    {
      uVar28 = *(uint *)&pCVar20[1].field_0;
      uVar19 = *(uint *)((long)&pCVar20[1].field_0 + 4);
      pCVar20 = on_the_fly_strengthen(this,pCVar20,uVar16);
      if ((this->opts).bump != 0) {
        bump_variables(this);
      }
      if (pCVar20 == (Clause *)0x0) {
        puVar29 = (this->mini_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar5 = (this->mini_chain).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar21 = puVar5 + -1;
        puVar13 = puVar29;
        if (puVar29 < puVar21 && puVar29 != puVar5) {
          do {
            puVar22 = puVar13 + 1;
            uVar10 = *puVar13;
            *puVar13 = *puVar21;
            *puVar21 = uVar10;
            puVar21 = puVar21 + -1;
            puVar13 = puVar22;
          } while (puVar22 < puVar21);
        }
        for (; puVar29 != puVar5; puVar29 = puVar29 + 1) {
          local_58 = *puVar29;
          iVar4._M_current =
               (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_50,iVar4,&local_58);
          }
          else {
            *iVar4._M_current = local_58;
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
        }
        puVar8 = (this->mini_chain).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar8) {
          (this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar8;
        }
        uVar16 = -(uVar16 ^ uVar28 ^ uVar19);
        clear_analyzed_levels(this);
        piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = 0x12;
        if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar6) {
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar6;
        }
LAB_00804cac:
        iVar18 = local_60._0_4_;
      }
      else {
        if ((local_60._0_4_ == 1) && (local_68 < local_70)) {
          c = this->conflict;
          piVar1 = &(this->stats).subsumed;
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)&(this->stats).subirr + (ulong)(*(uint *)&c->field_0x8 >> 8 & 8));
          *plVar2 = *plVar2 + 1;
          if (((c->field_0x9 & 8) == 0) && ((*(uint *)&pCVar20->field_0x8 >> 0xb & 1) != 0)) {
            *(uint *)&pCVar20->field_0x8 = *(uint *)&pCVar20->field_0x8 & 0xfffff7ff;
            if (this->proof != (Proof *)0x0) {
              Proof::strengthen(this->proof,(pCVar20->field_0).id);
            }
            mark_garbage(this,c);
            piVar1 = &(this->stats).irrlits;
            *piVar1 = *piVar1 + (long)pCVar20->size;
            lVar27 = (this->stats).current.irredundant;
            lVar14 = (this->stats).added.redundant;
            lVar15 = (this->stats).added.irredundant;
            (this->stats).current.redundant = (this->stats).current.redundant + -1;
            (this->stats).current.irredundant = lVar27 + 1;
            (this->stats).added.redundant = lVar14 + -1;
            (this->stats).added.irredundant = lVar15 + 1;
          }
          else {
            mark_garbage(this,c);
          }
          piVar1 = &(this->stats).otfs.subsumed;
          *piVar1 = *piVar1 + 1;
          piVar1 = &(this->stats).subsumed;
          *piVar1 = *piVar1 + 1;
          local_70 = local_70 + -1;
          piVar1 = &(this->stats).conflicts;
          *piVar1 = *piVar1 + 1;
        }
        this->conflict = pCVar20;
        if (local_64 == 1) {
          if ((long)pCVar20->size == 0) {
            uVar28 = 0;
            iVar18 = 0;
          }
          else {
            lVar27 = 0;
            uVar28 = 0;
            iVar18 = 0;
            do {
              uVar19 = *(uint *)((long)&pCVar20[1].field_0 + lVar27);
              uVar11 = -uVar19;
              if (0 < (int)uVar19) {
                uVar11 = uVar19;
              }
              iVar17 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar11].level;
              iVar12 = iVar18;
              if (iVar18 < iVar17) {
                iVar12 = iVar17;
              }
              if (iVar17 != this->level) {
                iVar18 = iVar12;
                uVar19 = uVar28;
              }
              uVar28 = uVar19;
              lVar27 = lVar27 + 4;
            } while ((long)pCVar20->size * 4 != lVar27);
          }
          iVar18 = determine_actual_backtrack_level(this,iVar18);
          EMA::update(local_40,this->internal,(double)iVar18,"averages.current.level");
          backtrack(this,iVar18);
          ptVar25 = (time_t *)(ulong)uVar28;
          search_assign_driving(this,uVar28,this->conflict);
          this->conflict = (Clause *)0x0;
          clear_analyzed_literals(this);
          clear_analyzed_levels(this);
          piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar6) {
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar6;
          }
          pIVar24 = this->internal;
          iVar17 = 1;
          if ((pIVar24->profiles).analyze.level <= (pIVar24->opts).profile) {
            time(pIVar24,ptVar25);
            stop_profiling(pIVar24,&(pIVar24->profiles).analyze,s_01);
          }
          goto LAB_00804cac;
        }
        clear_analyzed_literals(this);
        piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar6) {
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar6;
        }
        local_68 = 0;
        local_6c = 1;
        local_64 = 0;
        uVar28 = *(uint *)&pCVar20->field_0x8;
        *(uint *)&pCVar20->field_0x8 = uVar28 & 0xffff3fff | 0x4000;
        if ((uVar28 & 0x940) == 0x800) {
          iVar18 = recompute_glue(this,pCVar20);
          if (iVar18 < pCVar20->glue) {
            promote_clause(this,pCVar20,iVar18);
          }
          else if (((uVar28 & 0xc000) != 0) && (pCVar20->glue <= (this->opts).reducetier2glue)) {
            *(uint *)&pCVar20->field_0x8 = *(uint *)&pCVar20->field_0x8 & 0xffff3fff | 0x8000;
          }
        }
        if (this->lrat == true) {
          iVar4._M_current =
               (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_50,iVar4,(unsigned_long *)pCVar20);
          }
          else {
            *iVar4._M_current = (unsigned_long)pCVar20->field_0;
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
        }
        iVar18 = pCVar20->size;
        if ((long)iVar18 != 0) {
          lVar27 = 0;
          do {
            iVar17 = *(int *)((long)&pCVar20[1].field_0 + lVar27);
            if (iVar17 != 0) {
              analyze_literal(this,iVar17,&local_64,&local_68,&local_6c);
            }
            lVar27 = lVar27 + 4;
          } while ((long)iVar18 * 4 != lVar27);
        }
        local_70 = local_6c + -1;
        iVar18 = 0;
        iVar17 = 0;
      }
      if (iVar17 != 0) {
        if (iVar17 != 0x12) {
          return;
        }
LAB_00804e66:
        uVar28 = -uVar16;
        local_58 = CONCAT44(local_58._4_4_,uVar28);
        __position._M_current =
             (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->clause,__position,(int *)&local_58);
        }
        else {
          *__position._M_current = uVar28;
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar7 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = (int)((ulong)((long)(this->levels).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->levels).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
        local_60 = (double)iVar17;
        EMA::update(local_38,this->internal,local_60,"averages.current.glue.fast");
        EMA::update(&(this->averages).current.glue.slow,this->internal,local_60,
                    "averages.current.glue.slow");
        iVar18 = (int)((ulong)((long)piVar6 - (long)piVar7) >> 2);
        lVar27 = (this->stats).learned.clauses;
        (this->stats).learned.literals = (long)iVar18 + (this->stats).learned.literals;
        (this->stats).learned.clauses = lVar27 + 1;
        if (iVar18 < 2) {
          if (this->external->learner != (Learner *)0x0) {
            External::export_learned_unit_clause(this->external,uVar28);
          }
        }
        else {
          if ((this->opts).shrink == 0) {
            if ((this->opts).minimize != 0) {
              minimize_clause(this);
            }
          }
          else {
            shrink_and_minimize_clause(this);
          }
          iVar18 = (int)((ulong)((long)(this->clause).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->clause).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
          if ((this->opts).bump != 0) {
            bump_variables(this);
          }
          if (this->external->learner != (Learner *)0x0) {
            External::export_learned_large_clause(this->external,&this->clause);
          }
        }
        auVar30._0_4_ = -(uint)(iVar18 == 1);
        auVar30._4_4_ = -(uint)(iVar18 == 2);
        auVar30._8_4_ = -(uint)(iVar18 == 2);
        auVar30._12_4_ = 0xffffffff;
        auVar30 = auVar30 & _DAT_0093f760;
        (this->stats).units = (this->stats).units + auVar30._0_8_;
        (this->stats).binaries = (this->stats).binaries + auVar30._8_8_;
        EMA::update(&(this->averages).current.size,this->internal,(double)iVar18,
                    "averages.current.size");
        if (this->lrat == true) {
          local_60 = (double)CONCAT44(local_60._4_4_,uVar28);
          puVar21 = (this->unit_chain).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar29 = (this->unit_chain).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (puVar21 != puVar29) {
            do {
              local_58 = *puVar21;
              iVar4._M_current =
                   (this->lrat_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->lrat_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(local_50,iVar4,&local_58);
              }
              else {
                *iVar4._M_current = local_58;
                (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              puVar21 = puVar21 + 1;
            } while (puVar21 != puVar29);
          }
          puVar8 = (this->unit_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar8) {
            (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar8;
          }
          puVar8 = (this->lrat_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar9 = (this->lrat_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar23 = puVar9 + -1;
          uVar28 = local_60._0_4_;
          if (puVar8 < puVar23 && puVar8 != puVar9) {
            do {
              puVar21 = puVar8 + 1;
              uVar10 = *puVar8;
              *puVar8 = *puVar23;
              *puVar23 = uVar10;
              puVar23 = puVar23 + -1;
              puVar8 = puVar21;
            } while (puVar21 < puVar23);
          }
        }
        pCVar20 = new_driving_clause(this,iVar17,(int *)&local_58);
        iVar18 = (int)local_58;
        EMA::update(&(this->averages).current.jump,this->internal,(double)(int)local_58,
                    "averages.current.jump");
        uVar19 = determine_actual_backtrack_level(this,iVar18);
        EMA::update(local_40,this->internal,(double)(int)uVar19,"averages.current.level");
        ptVar25 = (time_t *)(ulong)uVar19;
        backtrack(this,uVar19);
        if (uVar16 == 0) {
          learn_empty_clause(this);
        }
        else {
          ptVar25 = (time_t *)(ulong)uVar28;
          search_assign_driving(this,uVar28,pCVar20);
        }
        if (this->stable == true) {
          Reluctant::tick(&this->reluctant);
        }
        clear_analyzed_literals(this);
        clear_unit_analyzed_literals(this);
        clear_analyzed_levels(this);
        piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar6) {
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar6;
        }
        this->conflict = (Clause *)0x0;
        puVar8 = (this->lrat_chain).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar8) {
          (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar8;
        }
        pIVar24 = this->internal;
        if ((pIVar24->profiles).analyze.level <= (pIVar24->opts).profile) {
          time(pIVar24,ptVar25);
          stop_profiling(pIVar24,&(pIVar24->profiles).analyze,s_03);
        }
        if (pCVar20 == (Clause *)0x0) {
          return;
        }
        if ((this->opts).eagersubsume == 0) {
          return;
        }
        eagerly_subsume_recently_learned_clauses(this,pCVar20);
        return;
      }
    }
    uVar26 = (ulong)(int)uVar26;
    uVar16 = 0;
    uVar28 = uVar16;
    do {
      uVar19 = (this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar26 - 1];
      uVar11 = -uVar19;
      if (0 < (int)uVar19) {
        uVar11 = uVar19;
      }
      if ((((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11] & 1) != 0) &&
         (uVar16 = uVar28,
         (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
         super__Vector_impl_data._M_start[uVar11].level == this->level)) {
        uVar16 = uVar19;
        uVar28 = uVar19;
      }
      uVar26 = uVar26 - 1;
    } while (uVar16 == 0);
    local_64 = local_64 + -1;
    if (local_64 == 0) goto LAB_00804e66;
    uVar28 = uVar16;
    if ((int)uVar16 < 1) {
      uVar28 = -uVar16;
    }
    pCVar20 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
              super__Vector_impl_data._M_start[uVar28].reason;
    if (pCVar20 == this->external_reason) {
      pCVar20 = learn_external_reason_clause(this,-uVar16,0,true);
      (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
      super__Vector_impl_data._M_start[uVar28].reason = pCVar20;
    }
    iVar18 = iVar18 + 1;
    local_68 = local_68 + -1;
  } while( true );
}

Assistant:

void Internal::analyze () {

  START (analyze);

  assert (conflict);
  assert (lrat_chain.empty ());
  assert (unit_chain.empty ());
  assert (unit_analyzed.empty ());
  assert (clause.empty ());

  // First update moving averages of trail height at conflict.
  //
  UPDATE_AVERAGE (averages.current.trail.fast, num_assigned);
  UPDATE_AVERAGE (averages.current.trail.slow, num_assigned);

  /*----------------------------------------------------------------------*/

  if (external_prop && !external_prop_is_lazy && opts.exteagerreasons) {
    explain_external_propagations ();
  }

  if (opts.chrono || external_prop) {

    int forced;

    const int conflict_level = find_conflict_level (forced);

    // In principle we can perform conflict analysis as in non-chronological
    // backtracking except if there is only one literal with the maximum
    // assignment level in the clause.  Then standard conflict analysis is
    // unnecessary and we can use the conflict as a driving clause.  In the
    // pseudo code of the SAT'18 paper on chronological backtracking this
    // corresponds to the situation handled in line 4-6 in Alg. 1, except
    // that the pseudo code in the paper only backtracks while we eagerly
    // assign the single literal on the highest decision level.

    if (forced) {

      assert (forced);
      assert (conflict_level > 0);
      LOG ("single highest level literal %d", forced);

      // The pseudo code in the SAT'18 paper actually backtracks to the
      // 'second highest decision' level, while their code backtracks
      // to 'conflict_level-1', which is more in the spirit of chronological
      // backtracking anyhow and thus we also do the latter.
      //
      backtrack (conflict_level - 1);

      // if we are on decision level 0 search assign will learn unit
      // so we need a valid chain here (of course if we are not on decision
      // level 0 this will not result in a valid chain).
      // we can just use build_chain_for_units in propagate
      //
      build_chain_for_units (forced, conflict, 0);

      LOG ("forcing %d", forced);
      search_assign_driving (forced, conflict);

      conflict = 0;
      STOP (analyze);
      return;
    }

    // Backtracking to the conflict level is in the pseudo code in the
    // SAT'18 chronological backtracking paper, but not in their actual
    // implementation.  In principle we do not need to backtrack here.
    // However, as a side effect of backtracking to the conflict level we
    // set 'level' to the conflict level which then allows us to reuse the
    // old 'analyze' code as is.  The alternative (which we also tried but
    // then abandoned) is to use 'conflict_level' instead of 'level' in the
    // analysis, which however requires to pass it to the 'analyze_reason'
    // and 'analyze_literal' functions.
    //
    backtrack (conflict_level);
  }

  // Actual conflict on root level, thus formula unsatisfiable.
  //
  if (!level) {
    learn_empty_clause ();
    if (external->learner)
      external->export_learned_empty_clause ();
    // lrat_chain.clear (); done in learn_empty_clause
    STOP (analyze);
    return;
  }

  /*----------------------------------------------------------------------*/

  // First derive the 1st UIP clause by going over literals assigned on the
  // current decision level.  Literals in the conflict are marked as 'seen'
  // as well as all literals in reason clauses of already 'seen' literals on
  // the current decision level.  Thus the outer loop starts with the
  // conflict clause as 'reason' and then uses the 'reason' of the next
  // seen literal on the trail assigned on the current decision level.
  // During this process maintain the number 'open' of seen literals on the
  // current decision level with not yet processed 'reason'.  As soon 'open'
  // drops to one, we have found the first unique implication point.  This
  // is sound because the topological order in which literals are processed
  // follows the assignment order and a more complex algorithm to find
  // articulation points is not necessary.
  //
  Clause *reason = conflict;
  LOG (reason, "analyzing conflict");

  assert (clause.empty ());
  assert (lrat_chain.empty ());

  const auto &t = &trail;
  int i = t->size ();      // Start at end-of-trail.
  int open = 0;            // Seen but not processed on this level.
  int uip = 0;             // The first UIP literal.
  int resolvent_size = 0;  // without the uip
  int antecedent_size = 1; // with the uip and without unit literals
  int conflict_size =
      0; // size of the conflict without the uip and without unit literals
  int resolved = 0; // number of resolution (0 = clause in CNF)
  const bool otfs = opts.otfs;

  for (;;) {
    antecedent_size = 1; // for uip
    analyze_reason (uip, reason, open, resolvent_size, antecedent_size);
    if (resolved == 0)
      conflict_size = antecedent_size - 1;
    assert (resolvent_size == open + (int) clause.size ());

    if (otfs && resolved > 0 && antecedent_size > 2 &&
        resolvent_size < antecedent_size) {
      assert (reason != conflict);
      LOG (analyzed, "found candidate for OTFS conflict");
      LOG (clause, "found candidate for OTFS conflict");
      LOG (reason, "found candidate (size %d) for OTFS resolvent",
           antecedent_size);
      const int other = reason->literals[0] ^ reason->literals[1] ^ uip;
      assert (other != uip);
      reason = on_the_fly_strengthen (reason, uip);
      if (opts.bump)
        bump_variables ();

      assert (conflict_size);
      if (!reason) {
        uip = -other;
        assert (open == 1);
        LOG ("clause is actually unit %d, stopping", -uip);
        reverse (begin (mini_chain), end (mini_chain));
        for (auto id : mini_chain)
          lrat_chain.push_back (id);
        mini_chain.clear ();
        clear_analyzed_levels ();
        assert (!opts.exteagerreasons);
        clause.clear ();
        break;
      }
      assert (conflict_size >= 2);

      if (resolved == 1 && resolvent_size < conflict_size) {
        // in this case both clauses are part of the CNF, so one subsumes
        // the other
        otfs_subsume_clause (reason, conflict);
        LOG (reason, "changing conflict to");
        --conflict_size;
        assert (conflict_size == reason->size);
        ++stats.otfs.subsumed;
        ++stats.subsumed;
        ++stats.conflicts;
      }

      LOG (reason, "changing conflict to");
      conflict = reason;
      if (open == 1) {
        int forced = 0;
        const int conflict_level = otfs_find_backtrack_level (forced);
        int new_level = determine_actual_backtrack_level (conflict_level);
        UPDATE_AVERAGE (averages.current.level, new_level);
        backtrack (new_level);

        LOG ("forcing %d", forced);
        search_assign_driving (forced, conflict);

        conflict = 0;
        // Clean up.
        //
        clear_analyzed_literals ();
        clear_analyzed_levels ();
        clause.clear ();
        STOP (analyze);
        return;
      }

      resolved = 0;
      clear_analyzed_literals ();
      // clear_analyzed_levels (); not needed because marking the exact same
      // again
      clause.clear ();
      resolvent_size = 0;
      antecedent_size = 1;
      open = 0;
      analyze_reason (0, reason, open, resolvent_size, antecedent_size);
      conflict_size = antecedent_size - 1;
      assert (open > 1);
    }

    ++resolved;

    uip = 0;
    while (!uip) {
      assert (i > 0);
      const int lit = (*t)[--i];
      if (!flags (lit).seen)
        continue;
      if (var (lit).level == level)
        uip = lit;
    }
    if (!--open)
      break;
    reason = var (uip).reason;
    if (reason == external_reason) {
      assert (!opts.exteagerreasons);
      reason = learn_external_reason_clause (-uip, 0, true);
      var (uip).reason = reason;
    }
    assert (reason != external_reason);
    LOG (reason, "analyzing %d reason", uip);
    assert (resolvent_size);
    --resolvent_size;
  }
  LOG ("first UIP %d", uip);
  clause.push_back (-uip);

  // Update glue and learned (1st UIP literals) statistics.
  //
  int size = (int) clause.size ();
  const int glue = (int) levels.size () - 1;
  LOG (clause, "1st UIP size %d and glue %d clause", size, glue);
  UPDATE_AVERAGE (averages.current.glue.fast, glue);
  UPDATE_AVERAGE (averages.current.glue.slow, glue);
  stats.learned.literals += size;
  stats.learned.clauses++;
  assert (glue < size);

  // up to this point lrat_chain contains the proof for current clause in
  // reversed order. in minimize and shrink the clause is changed and
  // therefore lrat_chain has to be extended. Unfortunately we cannot create
  // the chain directly during minimization (or shrinking) but afterwards we
  // can calculate it pretty easily and even better the same algorithm works
  // for both shrinking and minimization.

  // Minimize the 1st UIP clause as pioneered by Niklas Soerensson in
  // MiniSAT and described in our joint SAT'09 paper.
  //
  if (size > 1) {
    if (opts.shrink)
      shrink_and_minimize_clause ();
    else if (opts.minimize)
      minimize_clause ();

    size = (int) clause.size ();

    // Update decision heuristics.
    //
    if (opts.bump)
      bump_variables ();

    if (external->learner)
      external->export_learned_large_clause (clause);
  } else if (external->learner)
    external->export_learned_unit_clause (-uip);

  // Update actual size statistics.
  //
  stats.units += (size == 1);
  stats.binaries += (size == 2);
  UPDATE_AVERAGE (averages.current.size, size);

  // reverse lrat_chain. We could probably work with reversed iterators
  // (views) to be more efficient but we would have to distinguish in proof
  //
  if (lrat) {
    LOG (unit_chain, "unit chain: ");
    for (auto id : unit_chain)
      lrat_chain.push_back (id);
    unit_chain.clear ();
    reverse (lrat_chain.begin (), lrat_chain.end ());
  }

  // Determine back-jump level, learn driving clause, backtrack and assign
  // flipped 1st UIP literal.
  //
  int jump;
  Clause *driving_clause = new_driving_clause (glue, jump);
  UPDATE_AVERAGE (averages.current.jump, jump);

  int new_level = determine_actual_backtrack_level (jump);
  UPDATE_AVERAGE (averages.current.level, new_level);
  backtrack (new_level);

  // It should hold that (!level <=> size == 1)
  //                 and (!uip   <=> size == 0)
  // this means either we have already learned a clause => size >= 2
  // in this case we will not learn empty clause or unit here
  // or we haven't actually learned a clause in new_driving_clause
  // then lrat_chain is still valid and we will learn a unit or empty clause
  //
  if (uip) {
    search_assign_driving (-uip, driving_clause);
  } else
    learn_empty_clause ();

  if (stable)
    reluctant.tick (); // Reluctant has its own 'conflict' counter.

  // Clean up.
  //
  clear_analyzed_literals ();
  clear_unit_analyzed_literals ();
  clear_analyzed_levels ();
  clause.clear ();
  conflict = 0;

  lrat_chain.clear ();
  STOP (analyze);

  if (driving_clause && opts.eagersubsume)
    eagerly_subsume_recently_learned_clauses (driving_clause);
}